

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool deqp::egl::Image::isCompatibleCreateAndModifyActions(Action *create,Action *modify)

{
  bool bVar1;
  GLenum createFormat;
  long lVar2;
  
  bVar1 = false;
  lVar2 = __dynamic_cast(create,&Action::typeinfo,&GLES2ImageApi::Create::typeinfo,0);
  if (lVar2 != 0) {
    createFormat = (**(code **)(**(long **)(lVar2 + 8) + 0x28))();
    lVar2 = __dynamic_cast(modify,&Action::typeinfo,&GLES2ImageApi::ModifyTexSubImage::typeinfo,0);
    if (lVar2 != 0) {
      bVar1 = isCompatibleFormats(createFormat,*(GLenum *)(lVar2 + 8),*(GLenum *)(lVar2 + 0xc));
      return bVar1;
    }
    lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                           &GLES2ImageApi::ModifyRenderbufferClearColor::typeinfo,0);
    if ((lVar2 == 0) || ((bVar1 = false, createFormat != 0x81a5 && (createFormat != 0x8d48)))) {
      bVar1 = false;
      lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                             &GLES2ImageApi::ModifyRenderbufferClearDepth::typeinfo,0);
      if ((createFormat == 0x81a5) || (lVar2 == 0)) {
        lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                               &GLES2ImageApi::ModifyRenderbufferClearStencil::typeinfo,0);
        bVar1 = createFormat == 0x8d48 || lVar2 == 0;
      }
    }
  }
  return bVar1;
}

Assistant:

bool isCompatibleCreateAndModifyActions (const Action& create, const Action& modify)
{
	if (const GLES2ImageApi::Create* gles2Create = dynamic_cast<const GLES2ImageApi::Create*>(&create))
	{
		const GLenum createFormat = gles2Create->getEffectiveFormat();

		if (const GLES2ImageApi::ModifyTexSubImage* gles2TexSubImageModify = dynamic_cast<const GLES2ImageApi::ModifyTexSubImage*>(&modify))
		{
			const GLenum modifyFormat	= gles2TexSubImageModify->getFormat();
			const GLenum modifyType		= gles2TexSubImageModify->getType();

			return isCompatibleFormats(createFormat, modifyFormat, modifyType);
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearColor*>(&modify))
		{
			// reintepreting color as non-color is not meaningful
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearDepth*>(&modify))
		{
			// reintepreting depth as non-depth is not meaningful
			if (!isDepthFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearStencil*>(&modify))
		{
			// reintepreting stencil as non-stencil is not meaningful
			if (!isStencilFormat(createFormat))
				return false;
		}

		return true;
	}
	else
		DE_ASSERT(false);

	return false;
}